

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_gold_rewards_handling.hpp
# Opt level: O3

void __thiscall
PatchImproveGoldRewardsHandling::inject_data
          (PatchImproveGoldRewardsHandling *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  mapped_type *ppIVar2;
  long lVar3;
  ByteArray byte_array;
  key_type_conflict local_69;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = -0x30;
  do {
    local_69 = (char)lVar3 + 'p';
    ppIVar2 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at(&world->_items,&local_69);
    local_69 = (key_type_conflict)(*ppIVar2)->_gold_value;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,&local_69);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  uVar1 = md::ROM::inject_bytes(rom,&local_68,&local_50);
  this->_gold_rewards_table_addr = uVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        ByteArray byte_array;
        for(size_t id=ITEM_GOLDS_START ; id < ITEM_GOLDS_END ; ++id)
        {
            try {
                Item* gold_item = world.item(id);
                byte_array.add_byte(static_cast<uint8_t>(gold_item->gold_value()));
            } catch(std::out_of_range&) {
                break;
            }
        }

        _gold_rewards_table_addr = rom.inject_bytes(byte_array);
    }